

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

void png_formatted_warning(png_const_structrp png_ptr,char (*p) [32],png_const_charp message)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  char (*pacVar7) [32];
  char msg [192];
  
  uVar3 = 0;
  do {
    while( true ) {
      if ((0xbe < uVar3) || (cVar5 = *message, cVar5 == '\0')) {
        msg[uVar3] = '\0';
        png_warning(png_ptr,msg);
        return;
      }
      pcVar4 = message;
      if ((p != (char (*) [32])0x0) && (cVar5 == '@')) break;
LAB_00278cf4:
      message = pcVar4 + 1;
      msg[uVar3] = cVar5;
      uVar3 = uVar3 + 1;
    }
    cVar5 = message[1];
    if (cVar5 == '\0') {
      cVar5 = '@';
      goto LAB_00278cf4;
    }
    pacVar7 = p + -1;
    uVar6 = 0xffffffffffffffff;
    do {
      uVar1 = uVar6 + 1;
      pacVar7 = pacVar7 + 1;
      if (uVar6 == 8) break;
      lVar2 = uVar6 + 1;
      uVar6 = uVar1;
    } while ("123456789"[lVar2] != cVar5);
    pcVar4 = message + 1;
    if (7 < uVar1) goto LAB_00278cf4;
    uVar6 = 0;
    for (; uVar3 != 0xbf; uVar3 = uVar3 + 1) {
      pcVar4 = *pacVar7 + uVar6;
      if ((*pcVar4 == '\0') || (0x1f < uVar6)) goto LAB_00278d0b;
      uVar6 = uVar6 + 1;
      msg[uVar3] = *pcVar4;
    }
    uVar3 = 0xbf;
LAB_00278d0b:
    message = message + 2;
  } while( true );
}

Assistant:

void
png_formatted_warning(png_const_structrp png_ptr, png_warning_parameters p,
    png_const_charp message)
{
   /* The internal buffer is just 192 bytes - enough for all our messages,
    * overflow doesn't happen because this code checks!  If someone figures
    * out how to send us a message longer than 192 bytes, all that will
    * happen is that the message will be truncated appropriately.
    */
   size_t i = 0; /* Index in the msg[] buffer: */
   char msg[192];

   /* Each iteration through the following loop writes at most one character
    * to msg[i++] then returns here to validate that there is still space for
    * the trailing '\0'.  It may (in the case of a parameter) read more than
    * one character from message[]; it must check for '\0' and continue to the
    * test if it finds the end of string.
    */
   while (i<(sizeof msg)-1 && *message != '\0')
   {
      /* '@' at end of string is now just printed (previously it was skipped);
       * it is an error in the calling code to terminate the string with @.
       */
      if (p != NULL && *message == '@' && message[1] != '\0')
      {
         int parameter_char = *++message; /* Consume the '@' */
         static const char valid_parameters[] = "123456789";
         int parameter = 0;

         /* Search for the parameter digit, the index in the string is the
          * parameter to use.
          */
         while (valid_parameters[parameter] != parameter_char &&
            valid_parameters[parameter] != '\0')
            ++parameter;

         /* If the parameter digit is out of range it will just get printed. */
         if (parameter < PNG_WARNING_PARAMETER_COUNT)
         {
            /* Append this parameter */
            png_const_charp parm = p[parameter];
            png_const_charp pend = p[parameter] + (sizeof p[parameter]);

            /* No need to copy the trailing '\0' here, but there is no guarantee
             * that parm[] has been initialized, so there is no guarantee of a
             * trailing '\0':
             */
            while (i<(sizeof msg)-1 && *parm != '\0' && parm < pend)
               msg[i++] = *parm++;

            /* Consume the parameter digit too: */
            ++message;
            continue;
         }

         /* else not a parameter and there is a character after the @ sign; just
          * copy that.  This is known not to be '\0' because of the test above.
          */
      }

      /* At this point *message can't be '\0', even in the bad parameter case
       * above where there is a lone '@' at the end of the message string.
       */
      msg[i++] = *message++;
   }

   /* i is always less than (sizeof msg), so: */
   msg[i] = '\0';

   /* And this is the formatted message. It may be larger than
    * PNG_MAX_ERROR_TEXT, but that is only used for 'chunk' errors and these
    * are not (currently) formatted.
    */
   png_warning(png_ptr, msg);
}